

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

void __thiscall Memory::LargeHeapBlock::~LargeHeapBlock(LargeHeapBlock *this)

{
  PageHeapData *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HeapAllocator *this_01;
  
  if (((this->super_HeapBlock).segment != (Segment *)0x0) &&
     ((this->heapInfo->recyclerLargeBlockPageAllocator).super_IdleDecommitPageAllocator.
      super_PageAllocator.isClosed == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0xd2,
                       "(this->segment == nullptr || this->heapInfo->recyclerLargeBlockPageAllocator.IsClosed())"
                       ,"ReleasePages needs to be called before delete");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (this->pageHeapData != (PageHeapData *)0x0) {
    this_01 = HeapAllocator::GetNoMemProtectInstance();
    this_00 = this->pageHeapData;
    PageHeapData::~PageHeapData(this_00);
    HeapAllocator::Free(this_01,this_00,0x48);
    this->pageHeapData = (PageHeapData *)0x0;
  }
  BVSparse<Memory::HeapAllocator>::~BVSparse(&this->wbVerifyBits);
  return;
}

Assistant:

LargeHeapBlock::~LargeHeapBlock()
{
    AssertMsg(this->segment == nullptr || this->heapInfo->recyclerLargeBlockPageAllocator.IsClosed(),
        "ReleasePages needs to be called before delete");
    RECYCLER_PERF_COUNTER_DEC(LargeHeapBlockCount);

#ifdef RECYCLER_PAGE_HEAP
    if (pageHeapData)
    {
        NoMemProtectHeapDelete(pageHeapData);
        pageHeapData = nullptr;
    }
#endif
}